

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O3

int Abc_Tt8Cnf(word *t,int nVars,int *pCover)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  int nCubes;
  word uRes [4];
  uint local_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  word local_48 [5];
  
  local_68 = (uint)*t ^ 0xffffffff;
  uStack_64 = *(uint *)((long)t + 4) ^ 0xffffffff;
  uStack_60 = (uint)t[1] ^ 0xffffffff;
  uStack_5c = *(uint *)((long)t + 0xc) ^ 0xffffffff;
  local_58 = (uint)t[2] ^ 0xffffffff;
  uStack_54 = *(uint *)((long)t + 0x14) ^ 0xffffffff;
  uStack_50 = (uint)t[3] ^ 0xffffffff;
  uStack_4c = *(uint *)((long)t + 0x1c) ^ 0xffffffff;
  local_6c = 0;
  Abc_Tt8IsopCover(t,t,nVars,local_48,pCover,(int *)&local_6c);
  if ((long)(int)local_6c < 1) {
    uVar3 = 0;
  }
  else {
    lVar1 = 0;
    do {
      pCover[lVar1] = pCover[lVar1] | 1 << ((char)nVars * '\x02' & 0x1fU);
      lVar1 = lVar1 + 1;
      uVar3 = local_6c;
    } while ((int)local_6c != lVar1);
  }
  Abc_Tt8IsopCover((word *)&local_68,(word *)&local_68,nVars,local_48,pCover,(int *)&local_6c);
  if ((int)uVar3 < (int)local_6c) {
    uVar2 = (ulong)uVar3;
    do {
      pCover[uVar2] = pCover[uVar2] | 2 << ((char)nVars * '\x02' & 0x1fU);
      uVar2 = uVar2 + 1;
    } while (local_6c != uVar2);
  }
  if (0x100 < (int)local_6c) {
    __assert_fail("nCubes <= 256",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0xa14,"int Abc_Tt8Cnf(word *, int, int *)");
  }
  return local_6c;
}

Assistant:

static inline int Abc_Tt8Cnf( word t[4], int nVars, int * pCover )
{
    word uRes[4], tc[4] = {~t[0], ~t[1], ~t[2], ~t[3]};
    int c, nCubes = 0;
    Abc_Tt8IsopCover( t,  t,  nVars, uRes, pCover, &nCubes );
    for ( c = 0; c < nCubes; c++ )
        pCover[c] |= (1 << (2*nVars+0));
    Abc_Tt8IsopCover( tc, tc, nVars, uRes, pCover, &nCubes );
    for ( ; c < nCubes; c++ )
        pCover[c] |= (1 << (2*nVars+1));
    assert( nCubes <= 256 );
    return nCubes;
}